

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

int __thiscall
cnn::SimpleRNNBuilder::copy(SimpleRNNBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Parameters *pPVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppPVar5;
  const_reference pvVar6;
  const_reference ppPVar7;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  size_t i;
  SimpleRNNBuilder *rnn_simple;
  ulong local_20;
  
  sVar2 = std::
          vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
          ::size(&this->params);
  sVar3 = std::
          vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
          ::size((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  *)(dst + 0x28));
  if (sVar2 == sVar3) {
    local_20 = 0;
    while( true ) {
      sVar2 = std::
              vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
              ::size((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                      *)(dst + 0x28));
      if (sVar2 <= local_20) break;
      pvVar4 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[](&this->params,local_20);
      ppPVar5 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar4,0);
      pPVar1 = *ppPVar5;
      pvVar6 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                             *)(dst + 0x28),local_20);
      ppPVar7 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar6,0);
      Parameters::copy(pPVar1,(EVP_PKEY_CTX *)*ppPVar7,src_00);
      pvVar4 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[](&this->params,local_20);
      ppPVar5 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar4,1);
      pPVar1 = *ppPVar5;
      pvVar6 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                             *)(dst + 0x28),local_20);
      ppPVar7 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar6,1);
      Parameters::copy(pPVar1,(EVP_PKEY_CTX *)*ppPVar7,src_01);
      pvVar4 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[](&this->params,local_20);
      ppPVar5 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar4,2);
      pPVar1 = *ppPVar5;
      pvVar6 = std::
               vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ::operator[]((vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                             *)(dst + 0x28),local_20);
      ppPVar7 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                          (pvVar6,2);
      Parameters::copy(pPVar1,(EVP_PKEY_CTX *)*ppPVar7,src_02);
      local_20 = local_20 + 1;
    }
    return (int)local_20;
  }
  __assert_fail("params.size() == rnn_simple.params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/rnn.cc"
                ,0x72,"virtual void cnn::SimpleRNNBuilder::copy(const RNNBuilder &)");
}

Assistant:

void SimpleRNNBuilder::copy(const RNNBuilder & rnn) {
  const SimpleRNNBuilder & rnn_simple = (const SimpleRNNBuilder&)rnn;
  assert(params.size() == rnn_simple.params.size());
  for(size_t i = 0; i < rnn_simple.params.size(); ++i) {
      params[i][0]->copy(*rnn_simple.params[i][0]);
      params[i][1]->copy(*rnn_simple.params[i][1]);
      params[i][2]->copy(*rnn_simple.params[i][2]);
  }
}